

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O1

void __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::~SimpleQueue
          (SimpleQueue<helics::ActionMessage,_std::mutex> *this)

{
  pointer pAVar1;
  pointer pAVar2;
  int iVar3;
  pointer pAVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if ((iVar3 == 0) && (iVar3 = pthread_mutex_lock((pthread_mutex_t *)this), iVar3 == 0)) {
    pAVar1 = (this->pushElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (this->pushElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pAVar4 = pAVar1;
    if (pAVar2 != pAVar1) {
      do {
        helics::ActionMessage::~ActionMessage(pAVar4);
        pAVar4 = pAVar4 + 1;
      } while (pAVar4 != pAVar2);
      (this->pushElements).
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_finish = pAVar1;
    }
    pAVar1 = (this->pullElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (this->pullElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pAVar4 = pAVar1;
    if (pAVar2 != pAVar1) {
      do {
        helics::ActionMessage::~ActionMessage(pAVar4);
        pAVar4 = pAVar4 + 1;
      } while (pAVar4 != pAVar2);
      (this->pullElements).
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_finish = pAVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
              (&this->pullElements);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
              (&this->pushElements);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

~SimpleQueue()
        {
            // these locks are primarily for memory synchronization multiple
            // access in the destructor would be a bad thing
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            /** clear the elements as part of the destruction while the locks
             * are engaged*/
            pushElements.clear();
            pullElements.clear();
        }